

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int yaml_parser_parse_flow_sequence_entry(yaml_parser_t *parser,yaml_event_t *event,int first)

{
  yaml_mark_t **ppyVar1;
  yaml_parser_state_t **top;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  yaml_mark_t *pyVar9;
  yaml_token_t *pyVar10;
  yaml_parser_state_t *pyVar11;
  yaml_token_type_t yVar12;
  
  if (first == 0) {
    if (parser->token_available == 0) goto LAB_001ad6f1;
  }
  else {
    if ((parser->token_available == 0) &&
       (iVar8 = yaml_parser_fetch_more_tokens(parser), iVar8 == 0)) {
      pyVar10 = (yaml_token_t *)0x0;
    }
    else {
      pyVar10 = (parser->tokens).head;
    }
    pyVar9 = (parser->marks).top;
    if (pyVar9 == (parser->marks).end) {
      ppyVar1 = &(parser->marks).top;
      iVar8 = yaml_stack_extend(&(parser->marks).start,ppyVar1,&(parser->marks).end);
      if (iVar8 == 0) goto LAB_001ad917;
      pyVar9 = *ppyVar1;
    }
    (parser->marks).top = pyVar9 + 1;
    pyVar9->column = (pyVar10->start_mark).column;
    sVar2 = (pyVar10->start_mark).line;
    pyVar9->index = (pyVar10->start_mark).index;
    pyVar9->line = sVar2;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    pyVar10 = (parser->tokens).head;
    parser->stream_end_produced = (uint)(pyVar10->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = pyVar10 + 1;
LAB_001ad6f1:
    iVar8 = yaml_parser_fetch_more_tokens(parser);
    if (iVar8 == 0) {
      return 0;
    }
  }
  pyVar10 = (parser->tokens).head;
  if (pyVar10 == (yaml_token_t *)0x0) {
    return 0;
  }
  yVar12 = pyVar10->type;
  if (yVar12 != YAML_FLOW_SEQUENCE_END_TOKEN) {
    if (first == 0) {
      if (yVar12 != YAML_FLOW_ENTRY_TOKEN) {
        pyVar9 = (parser->marks).top;
        (parser->marks).top = pyVar9 + -1;
        sVar2 = (pyVar10->start_mark).column;
        sVar4 = (pyVar10->start_mark).index;
        sVar5 = (pyVar10->start_mark).line;
        sVar6 = pyVar9[-1].index;
        sVar7 = pyVar9[-1].line;
        sVar3 = pyVar9[-1].column;
        parser->error = YAML_PARSER_ERROR;
        parser->context = "while parsing a flow sequence";
        (parser->context_mark).index = sVar6;
        (parser->context_mark).line = sVar7;
        (parser->context_mark).column = sVar3;
        parser->problem = "did not find expected \',\' or \']\'";
        (parser->problem_mark).index = sVar4;
        (parser->problem_mark).line = sVar5;
        (parser->problem_mark).column = sVar2;
        return 0;
      }
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = 0;
      (parser->tokens).head = pyVar10 + 1;
      iVar8 = yaml_parser_fetch_more_tokens(parser);
      if (iVar8 == 0) {
        return 0;
      }
      pyVar10 = (parser->tokens).head;
      if (pyVar10 == (yaml_token_t *)0x0) {
        return 0;
      }
      yVar12 = pyVar10->type;
    }
    if (yVar12 != YAML_FLOW_SEQUENCE_END_TOKEN) {
      if (yVar12 != YAML_KEY_TOKEN) {
        pyVar11 = (parser->states).top;
        if (pyVar11 == (parser->states).end) {
          top = &(parser->states).top;
          iVar8 = yaml_stack_extend(&(parser->states).start,top,&(parser->states).end);
          if (iVar8 == 0) {
LAB_001ad917:
            parser->error = YAML_MEMORY_ERROR;
            return 0;
          }
          pyVar11 = *top;
        }
        (parser->states).top = pyVar11 + 1;
        *pyVar11 = YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE;
        iVar8 = yaml_parser_parse_node(parser,event,0,0);
        return iVar8;
      }
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_MAPPING_START_EVENT;
      sVar2 = (pyVar10->start_mark).line;
      (event->start_mark).index = (pyVar10->start_mark).index;
      (event->start_mark).line = sVar2;
      (event->start_mark).column = (pyVar10->start_mark).column;
      sVar2 = (pyVar10->end_mark).line;
      (event->end_mark).index = (pyVar10->end_mark).index;
      (event->end_mark).line = sVar2;
      (event->end_mark).column = (pyVar10->end_mark).column;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x200000001;
      goto LAB_001ad793;
    }
  }
  pyVar11 = (parser->states).top;
  (parser->states).top = pyVar11 + -1;
  parser->state = pyVar11[-1];
  ppyVar1 = &(parser->marks).top;
  *ppyVar1 = *ppyVar1 + -1;
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  (event->start_mark).index = 0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  (event->end_mark).column = 0;
  event->type = YAML_SEQUENCE_END_EVENT;
  (event->start_mark).column = (pyVar10->start_mark).column;
  sVar2 = (pyVar10->start_mark).line;
  (event->start_mark).index = (pyVar10->start_mark).index;
  (event->start_mark).line = sVar2;
  (event->end_mark).column = (pyVar10->end_mark).column;
  sVar2 = (pyVar10->end_mark).line;
  (event->end_mark).index = (pyVar10->end_mark).index;
  (event->end_mark).line = sVar2;
LAB_001ad793:
  parser->token_available = 0;
  parser->tokens_parsed = parser->tokens_parsed + 1;
  pyVar10 = (parser->tokens).head;
  parser->stream_end_produced = (uint)(pyVar10->type == YAML_STREAM_END_TOKEN);
  (parser->tokens).head = pyVar10 + 1;
  return 1;
}

Assistant:

static int
yaml_parser_parse_flow_sequence_entry(yaml_parser_t *parser,
        yaml_event_t *event, int first)
{
    yaml_token_t *token;

    if (first) {
        token = PEEK_TOKEN(parser);
        if (!PUSH(parser, parser->marks, token->start_mark))
            return 0;
        SKIP_TOKEN(parser);
    }

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type != YAML_FLOW_SEQUENCE_END_TOKEN)
    {
        if (!first) {
            if (token->type == YAML_FLOW_ENTRY_TOKEN) {
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) return 0;
            }
            else {
                return yaml_parser_set_parser_error_context(parser,
                        "while parsing a flow sequence", POP(parser, parser->marks),
                        "did not find expected ',' or ']'", token->start_mark);
            }
        }

        if (token->type == YAML_KEY_TOKEN) {
            parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE;
            MAPPING_START_EVENT_INIT(*event, NULL, NULL,
                    1, YAML_FLOW_MAPPING_STYLE,
                    token->start_mark, token->end_mark);
            SKIP_TOKEN(parser);
            return 1;
        }

        else if (token->type != YAML_FLOW_SEQUENCE_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 0, 0);
        }
    }

    parser->state = POP(parser, parser->states);
    (void)POP(parser, parser->marks);
    SEQUENCE_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
    SKIP_TOKEN(parser);
    return 1;
}